

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

ssize_t zt_cstr_any(char *s,ssize_t i,ssize_t j,char *set)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar4 = 0;
    lVar5 = 0;
  }
  else {
    lVar3 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar3) {
      lVar3 = sVar1 - 1;
    }
    lVar5 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar5) {
      lVar5 = sVar1 - 1;
    }
    lVar4 = lVar5;
    if (lVar5 < lVar3) {
      lVar4 = lVar3;
    }
    if (lVar3 < lVar5) {
      lVar5 = lVar3;
    }
  }
  while ((s[lVar5] == '\0' || (pcVar2 = strchr(set,(int)s[lVar5]), pcVar2 == (char *)0x0))) {
    lVar5 = lVar5 + 1;
    if (lVar4 + 1 == lVar5) {
      return -1;
    }
  }
  return lVar5;
}

Assistant:

ssize_t
zt_cstr_any(const char *s, ssize_t i, ssize_t j, const char *set) {
    zt_assert(s);
    zt_assert(set);

    CONVERT(s, i, j);

    zt_assert(i >= 0 && i <= j);

    for (; i <= j; i++) {
        if (s[i] != '\0' && strchr(set, s[i])) {
            return i;
        }
    }

    return -1;
}